

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O1

int Dar_RefactTryGraph(Aig_Man_t *pAig,Aig_Obj_t *pRoot,Vec_Ptr_t *vCut,Kit_Graph_t *pGraph,
                      int NodeMax,int LevelMax)

{
  Kit_Node_t *pKVar1;
  void *pvVar2;
  long lVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  Aig_Obj_t *pAVar14;
  Aig_Obj_t *pFanin1;
  
  iVar12 = 0;
  if ((pGraph->fConst == 0) && ((uint)pGraph->nLeaves <= ((uint)pGraph->eRoot >> 1 & 0x3fffffff))) {
    iVar10 = pGraph->nLeaves;
    if (0 < iVar10) {
      lVar3 = 2;
      lVar13 = 0;
      do {
        if (vCut->nSize <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pKVar1 = pGraph->pNodes;
        pvVar2 = vCut->pArray[lVar13];
        *(void **)((long)pKVar1 + lVar3 * 8 + -8) = pvVar2;
        uVar11 = (ulong)pvVar2 & 0xfffffffffffffffe;
        (&pKVar1->eEdge0)[lVar3 * 2] =
             (Kit_Edge_t)
             ((uint)(&pKVar1->eEdge0)[lVar3 * 2] & 0xffffc000 | *(uint *)(uVar11 + 0x1c) & 0x3fff);
        if ((~*(ulong *)(uVar11 + 0x18) & 0xffffff00000000) == 0) {
          __assert_fail("Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dar/darRefact.c"
                        ,0xf1,
                        "int Dar_RefactTryGraph(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Kit_Graph_t *, int, int)"
                       );
        }
        lVar13 = lVar13 + 1;
        iVar10 = pGraph->nLeaves;
        lVar3 = lVar3 + 3;
      } while (lVar13 < iVar10);
    }
    iVar12 = 0;
    if (iVar10 < pGraph->nSize) {
      lVar13 = (long)iVar10;
      lVar3 = lVar13 * 0x18 + 0x10;
      iVar12 = 0;
      do {
        pKVar1 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pKVar1 + lVar3 + -0x10);
        uVar9 = *(uint *)((long)pKVar1 + lVar3 + -0xc);
        uVar6 = uVar5 >> 1 & 0x3fffffff;
        uVar7 = uVar9 >> 1 & 0x3fffffff;
        pAVar14 = (Aig_Obj_t *)pKVar1[uVar6].field_2.pFunc;
        pFanin1 = (Aig_Obj_t *)pKVar1[uVar7].field_2.pFunc;
        if ((pAVar14 == (Aig_Obj_t *)0x0) || (pFanin1 == (Aig_Obj_t *)0x0)) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar14 = (Aig_Obj_t *)((ulong)pAVar14 ^ (ulong)(uVar5 & 1));
          pFanin1 = (Aig_Obj_t *)((ulong)pFanin1 ^ (ulong)(uVar9 & 1));
          pAVar4 = Aig_TableLookupTwo(pAig,pAVar14,pFanin1);
          if ((Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe) == pRoot) {
            return -1;
          }
        }
        if ((pAVar4 == (Aig_Obj_t *)0x0) ||
           (*(int *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x20) == pAig->nTravIds)) {
          if (NodeMax <= iVar12) {
            return -1;
          }
          iVar12 = iVar12 + 1;
        }
        uVar9 = *(uint *)&pKVar1[uVar6].field_0x10 & 0x3fff;
        uVar5 = *(uint *)&pKVar1[uVar7].field_0x10 & 0x3fff;
        if (uVar5 < uVar9) {
          uVar5 = uVar9;
        }
        uVar5 = uVar5 + 1;
        if (pAVar4 != (Aig_Obj_t *)0x0) {
          pAVar8 = (Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe);
          if (pAig->pConst1 == pAVar8) {
            uVar5 = 0;
          }
          else {
            pAVar14 = (Aig_Obj_t *)((ulong)pAVar14 & 0xfffffffffffffffe);
            if ((pAVar8 == pAVar14) ||
               (pAVar14 = (Aig_Obj_t *)((ulong)pFanin1 & 0xfffffffffffffffe), pAVar8 == pAVar14)) {
              uVar5 = *(uint *)&pAVar14->field_0x1c & 0xffffff;
            }
          }
        }
        if (LevelMax < (int)uVar5) {
          return -1;
        }
        *(Aig_Obj_t **)((long)pKVar1 + lVar3 + -8) = pAVar4;
        *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar3) =
             *(uint *)(&(pKVar1->eEdge0).field_0x0 + lVar3) & 0xffffc000 | uVar5 & 0x3fff;
        lVar13 = lVar13 + 1;
        lVar3 = lVar3 + 0x18;
      } while (lVar13 < pGraph->nSize);
    }
  }
  return iVar12;
}

Assistant:

int Dar_RefactTryGraph( Aig_Man_t * pAig, Aig_Obj_t * pRoot, Vec_Ptr_t * vCut, Kit_Graph_t * pGraph, int NodeMax, int LevelMax )
{
    Kit_Node_t * pNode, * pNode0, * pNode1;
    Aig_Obj_t * pAnd, * pAnd0, * pAnd1;
    int i, Counter, LevelNew, LevelOld;
    // check for constant function or a literal
    if ( Kit_GraphIsConst(pGraph) || Kit_GraphIsVar(pGraph) )
        return 0;
    // set the levels of the leaves
    Kit_GraphForEachLeaf( pGraph, pNode, i )
    {
        pNode->pFunc = Vec_PtrEntry(vCut, i);
        pNode->Level = Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level;
        assert( Aig_Regular((Aig_Obj_t *)pNode->pFunc)->Level < (1<<24)-1 );
    }
//printf( "Trying:\n" );
    // compute the AIG size after adding the internal nodes
    Counter = 0;
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Kit_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Kit_GraphNode( pGraph, pNode->eEdge1.Node );
        // get the AIG nodes corresponding to the children 
        pAnd0 = (Aig_Obj_t *)pNode0->pFunc; 
        pAnd1 = (Aig_Obj_t *)pNode1->pFunc; 
        if ( pAnd0 && pAnd1 )
        {
            // if they are both present, find the resulting node
            pAnd0 = Aig_NotCond( pAnd0, pNode->eEdge0.fCompl );
            pAnd1 = Aig_NotCond( pAnd1, pNode->eEdge1.fCompl );
            pAnd  = Aig_TableLookupTwo( pAig, pAnd0, pAnd1 );
            // return -1 if the node is the same as the original root
            if ( Aig_Regular(pAnd) == pRoot )
                return -1;
        }
        else
            pAnd = NULL;
        // count the number of added nodes
        if ( pAnd == NULL || Aig_ObjIsTravIdCurrent(pAig, Aig_Regular(pAnd)) )
        {
            if ( ++Counter > NodeMax )
                return -1;
        }
        // count the number of new levels
        LevelNew = 1 + Abc_MaxInt( pNode0->Level, pNode1->Level );
        if ( pAnd )
        {
            if ( Aig_Regular(pAnd) == Aig_ManConst1(pAig) )
                LevelNew = 0;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd0) )
                LevelNew = (int)Aig_Regular(pAnd0)->Level;
            else if ( Aig_Regular(pAnd) == Aig_Regular(pAnd1) )
                LevelNew = (int)Aig_Regular(pAnd1)->Level;
            LevelOld = (int)Aig_Regular(pAnd)->Level;
//            assert( LevelNew == LevelOld );
        }
        if ( LevelNew > LevelMax )
            return -1;
        pNode->pFunc = pAnd;
        pNode->Level = LevelNew;
/*
printf( "Checking " );
Ref_ObjPrint( pAnd0 );
printf( " and " );
Ref_ObjPrint( pAnd1 );
printf( "  Result " );
Ref_ObjPrint( pNode->pFunc );
printf( "\n" );
*/
    }
    return Counter;
}